

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

void __thiscall
duckdb::Relation::Create
          (Relation *this,string *schema_name,string *table_name,bool temporary,
          OnCreateConflict on_conflict)

{
  pointer pQVar1;
  long *plVar2;
  element_type *peVar3;
  pointer *__ptr;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> res;
  string prepended_message;
  shared_ptr<duckdb::Relation,_true> create;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_68;
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_20;
  
  CreateRel((Relation *)local_40,(string *)this,schema_name,SUB81(table_name,0),temporary);
  shared_ptr<duckdb::Relation,_true>::operator->((shared_ptr<duckdb::Relation,_true> *)local_40);
  Execute((Relation *)&local_68);
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_68);
  if ((pQVar1->super_BaseQueryResult).success != false) {
    if (local_68._M_head_impl != (QueryResult *)0x0) {
      (*((local_68._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult[1])();
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
    }
    return;
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_40 + 0x10),"Failed to create table \'",table_name);
  plVar2 = (long *)::std::__cxx11::string::append(local_40 + 0x10);
  local_60._0_8_ = *plVar2;
  peVar3 = (element_type *)(plVar2 + 2);
  if ((element_type *)local_60._0_8_ == peVar3) {
    local_60._16_8_ = peVar3->_vptr_Relation;
    local_60._24_8_ = plVar2[3];
    local_60._0_8_ = (element_type *)(local_60 + 0x10);
  }
  else {
    local_60._16_8_ = peVar3->_vptr_Relation;
  }
  local_60._8_8_ = plVar2[1];
  *plVar2 = (long)peVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._16_8_ != &local_20) {
    operator_delete((void *)local_40._16_8_);
  }
  pQVar1 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_68);
  BaseQueryResult::ThrowError(&pQVar1->super_BaseQueryResult,(string *)local_60);
}

Assistant:

void Relation::Create(const string &schema_name, const string &table_name, bool temporary,
                      OnCreateConflict on_conflict) {
	auto create = CreateRel(schema_name, table_name, temporary, on_conflict);
	auto res = create->Execute();
	if (res->HasError()) {
		const string prepended_message = "Failed to create table '" + table_name + "': ";
		res->ThrowError(prepended_message);
	}
}